

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Player.cpp
# Opt level: O1

void __thiscall Player::Player(Player *this,Player *toCopy)

{
  vector<Map::Country_*,_std::allocator<Map::Country_*>_> *pvVar1;
  Hand *this_00;
  DiceRoller *this_01;
  int *piVar2;
  _List_node_base *p_Var3;
  
  pvVar1 = (vector<Map::Country_*,_std::allocator<Map::Country_*>_> *)operator_new(0x18);
  (pvVar1->super__Vector_base<Map::Country_*,_std::allocator<Map::Country_*>_>)._M_impl.
  super__Vector_impl_data._M_start = (pointer)0x0;
  (pvVar1->super__Vector_base<Map::Country_*,_std::allocator<Map::Country_*>_>)._M_impl.
  super__Vector_impl_data._M_finish = (pointer)0x0;
  (pvVar1->super__Vector_base<Map::Country_*,_std::allocator<Map::Country_*>_>)._M_impl.
  super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  this->pOwnedCountries = pvVar1;
  this_00 = (Hand *)operator_new(8);
  Hand::Hand(this_00);
  this->pCards = this_00;
  this_01 = (DiceRoller *)operator_new(0x10);
  DiceRoller::DiceRoller(this_01);
  this->pDiceRoller = this_01;
  piVar2 = (int *)operator_new(4);
  *piVar2 = *toCopy->pPlayerId;
  this->pPlayerId = piVar2;
  p_Var3 = (_List_node_base *)operator_new(0x18);
  (((_List_base<Observer_*,_std::allocator<Observer_*>_> *)&p_Var3->_M_next)->_M_impl)._M_node.
  super__List_node_base._M_next = (_List_node_base *)0x0;
  p_Var3->_M_prev = (_List_node_base *)0x0;
  *(size_t *)(p_Var3 + 1) = 0;
  p_Var3->_M_prev = p_Var3;
  p_Var3->_M_next = p_Var3;
  this->pObservers = (list<Observer_*,_std::allocator<Observer_*>_> *)p_Var3;
  std::vector<Map::Country_*,_std::allocator<Map::Country_*>_>::operator=
            (this->pOwnedCountries,toCopy->pOwnedCountries);
  Hand::operator=(this->pCards,toCopy->pCards);
  DiceRoller::operator=(this->pDiceRoller,toCopy->pDiceRoller);
  *this->currentState = *toCopy->currentState;
  if ((list<Observer*,std::allocator<Observer*>> *)this->pObservers !=
      (list<Observer*,std::allocator<Observer*>> *)toCopy->pObservers) {
    std::__cxx11::list<Observer*,std::allocator<Observer*>>::
    _M_assign_dispatch<std::_List_const_iterator<Observer*>>
              ((list<Observer*,std::allocator<Observer*>> *)this->pObservers,
               *(undefined8 *)toCopy->pObservers);
    return;
  }
  return;
}

Assistant:

Player::Player(const Player &toCopy) {
    pOwnedCountries = new std::vector<Map::Country*>;
    pCards = new Hand();
    pDiceRoller = new DiceRoller();
    pPlayerId = new int(*toCopy.pPlayerId);
    pObservers = new std::list<Observer*>();
    *pOwnedCountries = *toCopy.pOwnedCountries;
    *pCards = *toCopy.pCards;
    *pDiceRoller = *toCopy.pDiceRoller;
    *currentState = *toCopy.currentState;
    *pObservers = *toCopy.pObservers;
}